

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzio.c
# Opt level: O2

int cm_zlib_gzread(gzFile file,voidp buf,uint len)

{
  int iVar1;
  uint uVar2;
  undefined4 uVar3;
  int iVar4;
  uint uVar5;
  int *piVar6;
  size_t sVar7;
  uLong uVar8;
  ulong __n;
  Bytef *start;
  gz_stream *s;
  uchar *__ptr;
  
  iVar4 = -2;
  if ((file != (gzFile)0x0) && (*(char *)((long)file + 0xac) == 'r')) {
    iVar1 = *(int *)((long)file + 0x70);
    iVar4 = -1;
    if ((iVar1 != -3) && (iVar1 != -1)) {
      if (iVar1 == 1) {
LAB_004df3a9:
        iVar4 = 0;
      }
      else {
        *(voidp *)((long)file + 0x18) = buf;
        *(uint *)((long)file + 0x20) = len;
        __ptr = (uchar *)buf;
        if ((len != 0) && (*(int *)((long)file + 200) != -1)) {
          *(char *)buf = (char)*(int *)((long)file + 200);
          *(long *)((long)file + 0x18) = *(long *)((long)file + 0x18) + 1;
          *(int *)((long)file + 0x20) = *(int *)((long)file + 0x20) + -1;
          *(undefined4 *)((long)file + 200) = 0xffffffff;
          *(long *)((long)file + 0xc0) = *(long *)((long)file + 0xc0) + 1;
          if (*(int *)((long)file + 0xcc) != 0) {
            *(undefined4 *)((long)file + 0x70) = 1;
            return 1;
          }
          buf = (voidp)((long)buf + 1);
          __ptr = (uchar *)buf;
        }
        while (uVar5 = *(uint *)((long)file + 0x20), uVar5 != 0) {
          uVar2 = *(uint *)((long)file + 8);
          sVar7 = (size_t)uVar2;
          if (*(int *)((long)file + 0xa8) != 0) {
            if (uVar2 == 0) {
LAB_004df579:
              sVar7 = fread(__ptr,1,(ulong)uVar5,*(FILE **)((long)file + 0x78));
              iVar4 = *(int *)((long)file + 0x20) - (int)sVar7;
              *(int *)((long)file + 0x20) = iVar4;
            }
            else {
              if (uVar2 < uVar5) {
                uVar5 = uVar2;
              }
              __n = (ulong)uVar5;
              memcpy(*(void **)((long)file + 0x18),*file,__n);
              __ptr = __ptr + __n;
              *(uchar **)((long)file + 0x18) = __ptr;
              *(ulong *)file = *file + __n;
              *(int *)((long)file + 8) = *(int *)((long)file + 8) - uVar5;
              uVar5 = *(int *)((long)file + 0x20) - uVar5;
              *(uint *)((long)file + 0x20) = uVar5;
              if (uVar5 != 0) goto LAB_004df579;
              iVar4 = 0;
            }
            uVar5 = len - iVar4;
            *(ulong *)((long)file + 0xb8) = (ulong)uVar5 + *(long *)((long)file + 0xb8);
            *(ulong *)((long)file + 0xc0) = (ulong)uVar5 + *(long *)((long)file + 0xc0);
            if (uVar5 != 0) {
              return uVar5;
            }
            *(undefined4 *)((long)file + 0x74) = 1;
            goto LAB_004df3a9;
          }
          if ((uVar2 == 0) && (sVar7 = 0, *(int *)((long)file + 0x74) == 0)) {
            piVar6 = __errno_location();
            *piVar6 = 0;
            sVar7 = fread(*(void **)((long)file + 0x80),1,0x4000,*(FILE **)((long)file + 0x78));
            *(int *)((long)file + 8) = (int)sVar7;
            if ((int)sVar7 != 0) {
LAB_004df478:
              *(undefined8 *)file = *(undefined8 *)((long)file + 0x80);
              uVar5 = *(uint *)((long)file + 0x20);
              goto LAB_004df486;
            }
            *(undefined4 *)((long)file + 0x74) = 1;
            iVar4 = ferror(*(FILE **)((long)file + 0x78));
            if (iVar4 == 0) goto LAB_004df478;
            uVar3 = 0xffffffff;
LAB_004df598:
            *(undefined4 *)((long)file + 0x70) = uVar3;
            break;
          }
LAB_004df486:
          *(long *)((long)file + 0xb8) = *(long *)((long)file + 0xb8) + (sVar7 & 0xffffffff);
          *(long *)((long)file + 0xc0) = *(long *)((long)file + 0xc0) + (ulong)uVar5;
          iVar4 = cm_zlib_inflate((z_streamp)file,0);
          *(int *)((long)file + 0x70) = iVar4;
          *(long *)((long)file + 0xb8) =
               *(long *)((long)file + 0xb8) - (ulong)*(uint *)((long)file + 8);
          *(long *)((long)file + 0xc0) =
               *(long *)((long)file + 0xc0) - (ulong)*(uint *)((long)file + 0x20);
          if (iVar4 == 1) {
            uVar8 = cm_zlib_crc32(*(unsigned_long *)((long)file + 0x90),(uchar *)buf,
                                  *(int *)((long)file + 0x18) - (int)buf);
            *(uLong *)((long)file + 0x90) = uVar8;
            buf = *(voidp *)((long)file + 0x18);
            uVar8 = getLong((gz_stream *)file);
            if (uVar8 != *(uLong *)((long)file + 0x90)) {
              uVar3 = 0xfffffffd;
              goto LAB_004df598;
            }
            getLong((gz_stream *)file);
            check_header((gz_stream *)file);
            if (*(int *)((long)file + 0x70) != 0) break;
            cm_zlib_inflateReset((z_streamp)file);
            uVar8 = cm_zlib_crc32(0,(uchar *)0x0,0);
            *(uLong *)((long)file + 0x90) = uVar8;
            iVar4 = *(int *)((long)file + 0x70);
          }
          if ((iVar4 != 0) || (*(int *)((long)file + 0x74) != 0)) break;
        }
        uVar8 = cm_zlib_crc32(*(unsigned_long *)((long)file + 0x90),(uchar *)buf,
                              *(int *)((long)file + 0x18) - (int)buf);
        *(uLong *)((long)file + 0x90) = uVar8;
        iVar4 = len - *(int *)((long)file + 0x20);
        if ((iVar4 == 0) && ((*(uint *)((long)file + 0x70) | 2) == 0xffffffff)) {
          iVar4 = -1;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int ZEXPORT gzread (file, buf, len)
    gzFile file;
    voidp buf;
    unsigned len;
{
    gz_stream *s = (gz_stream*)file;
    Bytef *start = (Bytef*)buf; /* starting point for crc computation */
    Byte  *next_out; /* == stream.next_out but not forced far (for MSDOS) */

    if (s == NULL || s->mode != 'r') return Z_STREAM_ERROR;

    if (s->z_err == Z_DATA_ERROR || s->z_err == Z_ERRNO) return -1;
    if (s->z_err == Z_STREAM_END) return 0;  /* EOF */

    next_out = (Byte*)buf;
    s->stream.next_out = (Bytef*)buf;
    s->stream.avail_out = len;

    if (s->stream.avail_out && s->back != EOF) {
        *next_out++ = s->back;
        s->stream.next_out++;
        s->stream.avail_out--;
        s->back = EOF;
        s->out++;
        start++;
        if (s->last) {
            s->z_err = Z_STREAM_END;
            return 1;
        }
    }

    while (s->stream.avail_out != 0) {

        if (s->transparent) {
            /* Copy first the lookahead bytes: */
            uInt n = s->stream.avail_in;
            if (n > s->stream.avail_out) n = s->stream.avail_out;
            if (n > 0) {
                zmemcpy(s->stream.next_out, s->stream.next_in, n);
                next_out += n;
                s->stream.next_out = next_out;
                s->stream.next_in   += n;
                s->stream.avail_out -= n;
                s->stream.avail_in  -= n;
            }
            if (s->stream.avail_out > 0) {
                s->stream.avail_out -=
                    (uInt)fread(next_out, 1, s->stream.avail_out, s->file);
            }
            len -= s->stream.avail_out;
            s->in  += len;
            s->out += len;
            if (len == 0) s->z_eof = 1;
            return (int)len;
        }
        if (s->stream.avail_in == 0 && !s->z_eof) {

            errno = 0;
            s->stream.avail_in = (uInt)fread(s->inbuf, 1, Z_BUFSIZE, s->file);
            if (s->stream.avail_in == 0) {
                s->z_eof = 1;
                if (ferror(s->file)) {
                    s->z_err = Z_ERRNO;
                    break;
                }
            }
            s->stream.next_in = s->inbuf;
        }
        s->in += s->stream.avail_in;
        s->out += s->stream.avail_out;
        s->z_err = inflate(&(s->stream), Z_NO_FLUSH);
        s->in -= s->stream.avail_in;
        s->out -= s->stream.avail_out;

        if (s->z_err == Z_STREAM_END) {
            /* Check CRC and original size */
            s->crc = crc32(s->crc, start, (uInt)(s->stream.next_out - start));
            start = s->stream.next_out;

            if (getLong(s) != s->crc) {
                s->z_err = Z_DATA_ERROR;
            } else {
                (void)getLong(s);
                /* The uncompressed length returned by above getlong() may be
                 * different from s->out in case of concatenated .gz files.
                 * Check for such files:
                 */
                check_header(s);
                if (s->z_err == Z_OK) {
                    inflateReset(&(s->stream));
                    s->crc = crc32(0L, Z_NULL, 0);
                }
            }
        }
        if (s->z_err != Z_OK || s->z_eof) break;
    }
    s->crc = crc32(s->crc, start, (uInt)(s->stream.next_out - start));

    if (len == s->stream.avail_out &&
        (s->z_err == Z_DATA_ERROR || s->z_err == Z_ERRNO))
        return -1;
    return (int)(len - s->stream.avail_out);
}